

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsscenebsptreeindex_p.cpp
# Opt level: O0

int __thiscall
QGraphicsSceneBspTreeIndex::qt_metacall(QGraphicsSceneBspTreeIndex *this,Call _c,int _id,void **_a)

{
  int _id_00;
  void **in_RCX;
  undefined4 in_EDX;
  Call in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _id_00 = QGraphicsSceneIndex::qt_metacall
                     ((QGraphicsSceneIndex *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),
                      (int)in_RCX,(void **)in_RDI);
  if (-1 < _id_00) {
    if (in_ESI == InvokeMetaMethod) {
      if (_id_00 < 3) {
        qt_static_metacall(in_RDI,InvokeMetaMethod,_id_00,in_RCX);
      }
      _id_00 = _id_00 + -3;
    }
    if (in_ESI == RegisterMethodArgumentMetaType) {
      if (_id_00 < 3) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      _id_00 = _id_00 + -3;
    }
    if ((((in_ESI == ReadProperty) || (in_ESI == WriteProperty)) || (in_ESI == ResetProperty)) ||
       ((in_ESI == BindableProperty || (in_ESI == RegisterPropertyMetaType)))) {
      qt_static_metacall(in_RDI,in_ESI,_id_00,in_RCX);
      _id_00 = _id_00 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return _id_00;
}

Assistant:

int QGraphicsSceneBspTreeIndex::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QGraphicsSceneIndex::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 3)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 3)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 3;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    return _id;
}